

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall
ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
          (ON__CChangeTextureCoordinateHelper *this,ON_Mesh *mesh,int newvcnt,float **mesh_T)

{
  int iVar1;
  uint uVar2;
  ON_Mesh *pOVar3;
  ON_2fPoint *pOVar4;
  ON_TextureCoordinates *pOVar5;
  float *pfVar6;
  bool bVar7;
  size_t new_capacity;
  bool *pbVar8;
  uint uVar9;
  long lVar10;
  ON_TextureCoordinates *local_38;
  
  this->m_mesh = mesh;
  this->m_mesh_dV = (ON_3dPointArray *)0x0;
  (this->m_TC)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00822938;
  (this->m_TC).m_a = (ON_TextureCoordinates **)0x0;
  (this->m_TC).m_count = 0;
  (this->m_TC).m_capacity = 0;
  this->m_vuse_count = 0;
  (this->m_vuse)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  (this->m_vuse).m_a = (uint *)0x0;
  (this->m_vuse).m_count = 0;
  (this->m_vuse).m_capacity = 0;
  ON_Mesh::DestroyTopology(mesh);
  ON_Mesh::DestroyPartition(this->m_mesh);
  ON_Mesh::DestroyTree(this->m_mesh,true);
  this->m_tci = -1;
  pOVar3 = this->m_mesh;
  iVar1 = (pOVar3->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar9 = newvcnt + iVar1;
  new_capacity = (size_t)(int)uVar9;
  if ((uint)(pOVar3->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar9) {
    ON_SimpleArray<ON_3fPoint>::SetCapacity
              (&(pOVar3->m_V).super_ON_SimpleArray<ON_3fPoint>,new_capacity);
  }
  bVar7 = ON_Mesh::HasDoublePrecisionVertices(this->m_mesh);
  pOVar3 = this->m_mesh;
  if (bVar7) {
    this->m_mesh_dV = &pOVar3->m_dV;
    if ((uint)(pOVar3->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar9) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(pOVar3->m_dV).super_ON_SimpleArray<ON_3dPoint>,new_capacity);
    }
  }
  else {
    ON_Mesh::DestroyDoublePrecisionVertices(pOVar3);
  }
  bVar7 = ON_Mesh::HasVertexNormals(this->m_mesh);
  this->m_bHasVertexNormals = bVar7;
  if ((bVar7) && ((uint)(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar9)) {
    ON_SimpleArray<ON_3fVector>::SetCapacity
              (&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,new_capacity);
  }
  bVar7 = ON_Mesh::HasTextureCoordinates(this->m_mesh);
  this->m_bHasVertexTextures = bVar7;
  if (bVar7) {
    pOVar3 = this->m_mesh;
    pOVar4 = (pOVar3->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    if ((uint)(pOVar3->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar9) {
      ON_SimpleArray<ON_2fPoint>::SetCapacity
                (&(pOVar3->m_T).super_ON_SimpleArray<ON_2fPoint>,new_capacity);
    }
    if (pOVar4 == (ON_2fPoint *)*mesh_T) {
      *mesh_T = &((this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x;
    }
  }
  bVar7 = ON_Mesh::HasVertexColors(this->m_mesh);
  this->m_bHasVertexColors = bVar7;
  if ((bVar7) && ((uint)(this->m_mesh->m_C).m_capacity < uVar9)) {
    ON_SimpleArray<ON_Color>::SetCapacity(&this->m_mesh->m_C,new_capacity);
  }
  bVar7 = ON_Mesh::HasSurfaceParameters(this->m_mesh);
  this->m_bHasSurfaceParameters = bVar7;
  if ((bVar7) && ((uint)(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar9)) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,new_capacity);
  }
  bVar7 = ON_Mesh::HasPrincipalCurvatures(this->m_mesh);
  this->m_bHasPrincipalCurvatures = bVar7;
  if ((bVar7) && ((uint)(this->m_mesh->m_K).m_capacity < uVar9)) {
    ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this->m_mesh->m_K,new_capacity);
  }
  pbVar8 = ON_Mesh::HiddenVertexArray(this->m_mesh);
  this->m_bHasHiddenVertices = pbVar8 != (bool *)0x0;
  if ((pbVar8 != (bool *)0x0) && ((uint)(this->m_mesh->m_H).m_capacity < uVar9)) {
    ON_SimpleArray<bool>::SetCapacity(&this->m_mesh->m_H,new_capacity);
  }
  this->m_bHasCachedTextures = false;
  uVar2 = (this->m_mesh->m_TC).m_count;
  if ((uint)(this->m_TC).m_capacity < uVar2) {
    ON_SimpleArray<ON_TextureCoordinates_*>::SetCapacity(&this->m_TC,(long)(int)uVar2);
  }
  if (0 < (int)uVar2) {
    lVar10 = 0;
    do {
      pOVar5 = (this->m_mesh->m_TC).m_a;
      if (iVar1 == *(int *)((long)&(pOVar5->m_T).m_count + lVar10)) {
        this->m_bHasCachedTextures = true;
        pfVar6 = *(float **)((long)&(pOVar5->m_T).m_a + lVar10);
        if (*(uint *)((long)&(pOVar5->m_T).m_capacity + lVar10) < uVar9) {
          ON_SimpleArray<ON_3fPoint>::SetCapacity
                    ((ON_SimpleArray<ON_3fPoint> *)
                     ((long)&(pOVar5->m_T)._vptr_ON_SimpleArray + lVar10),new_capacity);
        }
        if (pfVar6 == *mesh_T) {
          *mesh_T = *(float **)((long)&(pOVar5->m_T).m_a + lVar10);
        }
        local_38 = (ON_TextureCoordinates *)((pOVar5->m_tag).m_mapping_id.Data4 + lVar10 + -8);
        ON_SimpleArray<ON_TextureCoordinates_*>::Append(&this->m_TC,&local_38);
      }
      lVar10 = lVar10 + 0xb8;
    } while ((long)(int)uVar2 * 0xb8 - lVar10 != 0);
  }
  return;
}

Assistant:

ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper(
    ON_Mesh& mesh,
    int newvcnt,
    float*& mesh_T )
: m_mesh(mesh)
, m_mesh_dV(0)
, m_vuse_count(0)
{
  // adding vertices invalidates this cached information.
  m_mesh.DestroyTopology();
  m_mesh.DestroyPartition();
  m_mesh.DestroyTree();

  m_tci = -1;

  const int vcnt = m_mesh.m_V.Count();

  // It is critical to reserve enough room in the arrays
  // before duplication starts.  Otherwise, during duplication,
  // a dynamic array can be reallocated, which will make
  // saved array base pointers will be invalid, and you crash
  // the next time they are used.

  m_mesh.m_V.Reserve(vcnt+newvcnt);

  if ( m_mesh.HasDoublePrecisionVertices() )
  {
    m_mesh_dV = &m_mesh.m_dV;
    m_mesh_dV->Reserve(vcnt+newvcnt);
  }
  else
  {
    m_mesh.DestroyDoublePrecisionVertices();
  }

  m_bHasVertexNormals = m_mesh.HasVertexNormals();
  if ( m_bHasVertexNormals )
    m_mesh.m_N.Reserve(vcnt+newvcnt);

  m_bHasVertexTextures = m_mesh.HasTextureCoordinates();
  if ( m_bHasVertexTextures )
  {
    float* p = (float*)m_mesh.m_T.Array();
    m_mesh.m_T.Reserve(vcnt+newvcnt);
    if ( p == mesh_T )
      mesh_T = (float*)m_mesh.m_T.Array();
  }

  m_bHasVertexColors = m_mesh.HasVertexColors();
  if ( m_bHasVertexColors )
    m_mesh.m_C.Reserve(vcnt+newvcnt);

  m_bHasSurfaceParameters = m_mesh.HasSurfaceParameters();
  if ( m_bHasSurfaceParameters )
    m_mesh.m_S.Reserve(vcnt+newvcnt);

  m_bHasPrincipalCurvatures = m_mesh.HasPrincipalCurvatures();
  if ( m_bHasPrincipalCurvatures )
    m_mesh.m_K.Reserve(vcnt+newvcnt);

  m_bHasHiddenVertices = (0 != m_mesh.HiddenVertexArray());
  if ( m_bHasHiddenVertices )
    m_mesh.m_H.Reserve(vcnt+newvcnt);

  // Set m_TC[] to be the subset of m_mesh.m_TC[] that is
  // valid for duplication.
  m_bHasCachedTextures = false;
  int tci, tccount = m_mesh.m_TC.Count();
  m_TC.Reserve(tccount);
  for ( tci = 0; tci < tccount; tci++ )
  {
    ON_TextureCoordinates& tc = m_mesh.m_TC[tci];
    if ( vcnt == tc.m_T.Count() )
    {
      m_bHasCachedTextures = true;
      float* p = (float*)tc.m_T.Array();
      tc.m_T.Reserve(vcnt+newvcnt);
      if ( p == mesh_T )
        mesh_T = (float*)tc.m_T.Array();
      m_TC.Append( &tc );
    }
  }
}